

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

string * flatbuffers::NumToString<unsigned_int>(string *__return_storage_ptr__,uint t)

{
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string NumToString(T t) {
  // to_string() prints different numbers of digits for floats depending on
  // platform and isn't available on Android, so we use stringstream
  std::stringstream ss;
  if (sizeof(T) > 1) ss << t;
  else ss << static_cast<int>(t);  // Avoid char types used as character data.
  return ss.str();
}